

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O1

data_type * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::text_grid::data_type>::allocate_array
          (memory_manager_stateless_kernel_1<dlib::text_grid::data_type> *this,unsigned_long size)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  long lVar7;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = size;
  uVar4 = SUB168(auVar3 * ZEXT816(0x58),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x58),8) == 0) {
    uVar4 = uVar5;
  }
  puVar6 = (unsigned_long *)operator_new__(uVar4);
  *puVar6 = size;
  if (size != 0) {
    lVar7 = 0;
    do {
      *(long *)((long)puVar6 + lVar7 + 8) = (long)puVar6 + lVar7 + 0x18;
      *(undefined8 *)((long)puVar6 + lVar7 + 0x10) = 0;
      *(undefined4 *)((long)puVar6 + lVar7 + 0x18) = 0;
      *(undefined4 *)((long)puVar6 + lVar7 + 0x28) = 0xff000000;
      *(undefined2 *)((long)puVar6 + lVar7 + 0x2c) = 0xffff;
      puVar1 = (undefined8 *)((long)puVar6 + lVar7 + 0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar2 = (undefined4 *)((long)puVar6 + lVar7 + 0x40);
      *puVar2 = 0xffffffff;
      puVar2[1] = 0xffffffff;
      puVar2[2] = 0xffffffff;
      puVar2[3] = 0xffffffff;
      *(undefined8 *)((long)puVar6 + lVar7 + 0x50) = 0;
      *(undefined1 *)((long)puVar6 + lVar7 + 0x58) = 1;
      lVar7 = lVar7 + 0x58;
    } while (size * 0x58 - lVar7 != 0);
  }
  return (data_type *)(puVar6 + 1);
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }